

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>
               (GetterYs<long_long> *getter1,GetterYRef *getter2,TransformerLinLin *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  LineSegmentsRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar7 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar9 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar9 = getter1->Count;
    }
    if (0 < iVar9) {
      iVar10 = 0;
      dVar14 = 0.0;
      pIVar8 = GImPlot;
      do {
        iVar4 = getter1->Count;
        iVar5 = transformer->YAxis;
        pIVar6 = pIVar8->CurrentPlot;
        IVar2 = pIVar8->PixelRange[iVar5].Min;
        dVar3 = (pIVar6->XAxis).Range.Min;
        fVar12 = (float)(pIVar8->Mx * ((getter1->XScale * dVar14 + getter1->X0) - dVar3) +
                        (double)IVar2.x);
        fVar13 = (float)(pIVar8->My[iVar5] *
                         ((double)*(long *)((long)getter1->Ys +
                                           (long)(((getter1->Offset + iVar10) % iVar4 + iVar4) %
                                                 iVar4) * (long)getter1->Stride) -
                         pIVar6->YAxis[iVar5].Range.Min) + (double)IVar2.y);
        local_58.Getter1 = (GetterYs<long_long> *)CONCAT44(fVar13,fVar12);
        IVar2 = pIVar8->PixelRange[iVar5].Min;
        local_60.x = (float)(pIVar8->Mx * ((getter2->XScale * dVar14 + getter2->X0) - dVar3) +
                            (double)IVar2.x);
        local_60.y = (float)(pIVar8->My[iVar5] * (getter2->YRef - pIVar6->YAxis[iVar5].Range.Min) +
                            (double)IVar2.y);
        pIVar6 = pIVar7->CurrentPlot;
        fVar11 = fVar13;
        if (local_60.y <= fVar13) {
          fVar11 = local_60.y;
        }
        if ((fVar11 < (pIVar6->PlotRect).Max.y) &&
           (fVar11 = (float)(~-(uint)(local_60.y <= fVar13) & (uint)local_60.y |
                            -(uint)(local_60.y <= fVar13) & (uint)fVar13),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar11 && fVar11 != *pfVar1)) {
          fVar11 = fVar12;
          if (local_60.x <= fVar12) {
            fVar11 = local_60.x;
          }
          if ((fVar11 < (pIVar6->PlotRect).Max.x) &&
             (fVar11 = (float)(~-(uint)(local_60.x <= fVar12) & (uint)local_60.x |
                              (uint)fVar12 & -(uint)(local_60.x <= fVar12)),
             (pIVar6->PlotRect).Min.x <= fVar11 && fVar11 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)&local_58,&local_60,col,line_weight);
            pIVar8 = GImPlot;
          }
        }
        dVar14 = dVar14 + 1.0;
        iVar10 = iVar10 + 1;
      } while (iVar9 != iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}